

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

bool __thiscall
Wasm::PolymorphicEmitInfo::IsEquivalent(PolymorphicEmitInfo *this,PolymorphicEmitInfo other)

{
  EmitInfo EVar1;
  EmitInfo EVar2;
  uint index;
  bool bVar3;
  undefined1 local_40 [8];
  PolymorphicEmitInfo other_local;
  
  other_local._0_8_ = other.field_1;
  local_40._0_4_ = other.count;
  if (this->count == local_40._0_4_) {
    bVar3 = this->count == 0;
    if (!bVar3) {
      EVar1 = GetInfo(this,0);
      EVar2 = GetInfo((PolymorphicEmitInfo *)local_40,0);
      if (((ulong)EVar2 ^ (ulong)EVar1) >> 0x20 == 0) {
        index = 1;
        do {
          bVar3 = this->count <= index;
          if (bVar3) {
            return bVar3;
          }
          EVar1 = GetInfo(this,index);
          EVar2 = GetInfo((PolymorphicEmitInfo *)local_40,index);
          index = index + 1;
        } while (((ulong)EVar2 ^ (ulong)EVar1) >> 0x20 == 0);
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool PolymorphicEmitInfo::IsEquivalent(PolymorphicEmitInfo other) const
{
    if (Count() != other.Count())
    {
        return false;
    }
    for (uint32 i = 0; i < Count(); ++i)
    {
        if (GetInfo(i).type != other.GetInfo(i).type)
        {
            return false;
        }
    }
    return true;
}